

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall kj::anon_unknown_31::WebSocketPipeImpl::~WebSocketPipeImpl(WebSocketPipeImpl *this)

{
  ForkHub<kj::_::Void> *pFVar1;
  Disposer *pDVar2;
  PromiseFulfiller<void> *pPVar3;
  WebSocket *pWVar4;
  Fault f;
  Fault local_18;
  
  if (((this->state).ptr != (WebSocket *)0x0) && ((this->ownState).ptr == (WebSocket *)0x0)) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[86]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xa0a,FAILED,"state == nullptr || ownState.get() != nullptr",
               "\"destroying WebSocketPipe with operation still in-progress; probably going to segfault\""
               ,(char (*) [86])
                "destroying WebSocketPipe with operation still in-progress; probably going to segfault"
              );
    _::Debug::Fault::~Fault(&local_18);
  }
  if (((this->abortedPromise).ptr.isSet == true) &&
     (pFVar1 = (this->abortedPromise).ptr.field_1.value.hub.ptr,
     pFVar1 != (ForkHub<kj::_::Void> *)0x0)) {
    (this->abortedPromise).ptr.field_1.value.hub.ptr = (ForkHub<kj::_::Void> *)0x0;
    pDVar2 = (this->abortedPromise).ptr.field_1.value.hub.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&(pFVar1->super_ForkHubBase).super_Refcounted.super_Disposer.
                              _vptr_Disposer +
                      (long)(pFVar1->super_ForkHubBase).super_Refcounted.super_Disposer.
                            _vptr_Disposer[-2]));
  }
  pPVar3 = (this->abortedFulfiller).ptr.ptr;
  if (pPVar3 != (PromiseFulfiller<void> *)0x0) {
    (this->abortedFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
    pDVar2 = (this->abortedFulfiller).ptr.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&pPVar3->_vptr_PromiseFulfiller +
                      (long)pPVar3->_vptr_PromiseFulfiller[-2]));
  }
  pWVar4 = (this->ownState).ptr;
  if (pWVar4 != (WebSocket *)0x0) {
    (this->ownState).ptr = (WebSocket *)0x0;
    pDVar2 = (this->ownState).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&pWVar4->_vptr_WebSocket + (long)pWVar4->_vptr_WebSocket[-2]));
  }
  Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~WebSocketPipeImpl() noexcept(false) {
    KJ_REQUIRE(state == nullptr || ownState.get() != nullptr,
        "destroying WebSocketPipe with operation still in-progress; probably going to segfault") {
      // Don't std::terminate().
      break;
    }
  }